

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::StrengthReductionPass::ScanFunctions(StrengthReductionPass *this)

{
  Module *pMVar1;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var2;
  long *plVar3;
  long lVar4;
  bool bVar5;
  Instruction **ppIVar6;
  bool bVar7;
  long *plVar8;
  iterator local_48;
  pointer local_40;
  pointer local_38;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_40 = *(pointer *)
              ((long)&(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              + 8);
  bVar7 = false;
  for (local_38 = *(pointer *)
                   &(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                    ._M_impl; local_38 != local_40; local_38 = local_38 + 1) {
    _Var2.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
         (local_38->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
    ;
    plVar3 = *(long **)((long)_Var2.
                              super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                              .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl
                       + 0xa0);
    for (plVar8 = *(long **)((long)_Var2.
                                   super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                   .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                   _M_head_impl + 0x98); plVar8 != plVar3; plVar8 = plVar8 + 1) {
      lVar4 = *plVar8;
      ppIVar6 = (Instruction **)(lVar4 + 0x20);
      while( true ) {
        local_48.super_iterator.node_ = (iterator)*ppIVar6;
        if (local_48.super_iterator.node_ == (Instruction *)(lVar4 + 0x18)) break;
        if (((Instruction *)local_48.super_iterator.node_)->opcode_ == OpIMul) {
          bVar5 = ReplaceMultiplyByPowerOf2(this,&local_48);
          bVar7 = (bool)(bVar7 | bVar5);
        }
        ppIVar6 = &(((Instruction *)local_48.super_iterator.node_)->
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
    }
  }
  return bVar7;
}

Assistant:

bool StrengthReductionPass::ScanFunctions() {
  // I did not use |ForEachInst| in the module because the function that acts on
  // the instruction gets a pointer to the instruction.  We cannot use that to
  // insert a new instruction.  I want an iterator.
  bool modified = false;
  for (auto& func : *get_module()) {
    for (auto& bb : func) {
      for (auto inst = bb.begin(); inst != bb.end(); ++inst) {
        switch (inst->opcode()) {
          case spv::Op::OpIMul:
            if (ReplaceMultiplyByPowerOf2(&inst)) modified = true;
            break;
          default:
            break;
        }
      }
    }
  }
  return modified;
}